

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O0

ScriptError
sigopcount_tests::VerifyWithFlag(CTransaction *output,CMutableTransaction *input,uint32_t flags)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_FS_OFFSET;
  bool ret;
  ScriptError error;
  CTransaction inputi;
  CTransaction *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  CTransaction *in_stack_fffffffffffffe60;
  GenericTransactionSignatureChecker<CTransaction> *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  CScript *line_num;
  CMutableTransaction *in_stack_fffffffffffffe80;
  const_string *file;
  CTransaction *in_stack_fffffffffffffe88;
  unit_test_log_t *this;
  const_string local_130 [2];
  _func_int **in_stack_fffffffffffffef0;
  BaseSignatureChecker *in_stack_fffffffffffffef8;
  uint in_stack_ffffffffffffff04;
  CScriptWitness *in_stack_ffffffffffffff08;
  CScript *in_stack_ffffffffffffff10;
  element_type *in_stack_ffffffffffffff18;
  ScriptError in_stack_ffffffffffffff74;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  this = (unit_test_log_t *)0x0;
  pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                      CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  line_num = &pvVar4->scriptSig;
  pvVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                      CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  file = (const_string *)&pvVar5->scriptPubKey;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  GenericTransactionSignatureChecker<CTransaction>::GenericTransactionSignatureChecker
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
             (CAmount *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (MissingDataBehavior)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  uVar2 = VerifyScript((CScript *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8
                       ,(ScriptError *)in_stack_fffffffffffffef0);
  GenericTransactionSignatureChecker<CTransaction>::~GenericTransactionSignatureChecker
            ((GenericTransactionSignatureChecker<CTransaction> *)in_stack_fffffffffffffe48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,file,(size_t)line_num,(const_string *)CONCAT17(uVar2,in_stack_fffffffffffffe70))
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (bool)in_stack_fffffffffffffe57);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (pointer)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               (unsigned_long)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe48 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffff10,(lazy_ostream *)&stack0xfffffffffffffef0
               ,local_130,0x4d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe48);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  CTransaction::~CTransaction(in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_stack_ffffffffffffff74;
  }
  __stack_chk_fail();
}

Assistant:

static ScriptError VerifyWithFlag(const CTransaction& output, const CMutableTransaction& input, uint32_t flags)
{
    ScriptError error;
    CTransaction inputi(input);
    bool ret = VerifyScript(inputi.vin[0].scriptSig, output.vout[0].scriptPubKey, &inputi.vin[0].scriptWitness, flags, TransactionSignatureChecker(&inputi, 0, output.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &error);
    BOOST_CHECK((ret == true) == (error == SCRIPT_ERR_OK));

    return error;
}